

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NewEdgeCalculator::iterateCovAp
          (NewEdgeCalculator *this,bool pe1,uint *pos2,double *probM,uint *pos1,uint *equalBase,
          bool pe2,vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                   *cov_ap2,int *tc,double *prob0,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          AlignmentRecord *ap1,int *cc)

{
  uint uVar1;
  uint uVar2;
  NewEdgeCalculator *this_00;
  NewEdgeCalculator *pNVar3;
  mapValue *pmVar4;
  const_reference val1;
  const_reference val2;
  double *in_RCX;
  uint *in_RDX;
  byte in_SIL;
  NewEdgeCalculator *in_RDI;
  uint *in_R8;
  int *in_R9;
  bool bVar5;
  byte in_stack_00000008;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_stack_00000010;
  int *in_stack_00000018;
  AlignmentRecord *in_stack_00000028;
  value_type *v2;
  value_type *v1;
  undefined7 in_stack_00000040;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  mapValue *in_stack_ffffffffffffff98;
  
LAB_00266175:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          this_00 = (NewEdgeCalculator *)(ulong)*in_R8;
          pNVar3 = (NewEdgeCalculator *)
                   std::
                   vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
                   size((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                         *)v2);
          bVar5 = false;
          if (this_00 < pNVar3) {
            in_stack_ffffffffffffff98 = (mapValue *)(ulong)*in_RDX;
            pmVar4 = (mapValue *)
                     std::
                     vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
                     size(in_stack_00000010);
            bVar5 = in_stack_ffffffffffffff98 < pmVar4;
          }
          if (!bVar5) {
            return;
          }
          val1 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 ::operator[]((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                               *)v2,(ulong)*in_R8);
          val2 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 ::operator[](in_stack_00000010,(ulong)*in_RDX);
          if (val1->ref != val2->ref) break;
          if (val1->base == val2->base) {
            *in_R9 = *in_R9 + 1;
          }
          calculateProbM(in_RDI,val1,val2,in_RCX);
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,unsigned_int&>
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00,
                     (uint *)in_stack_ffffffffffffff98,
                     (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          *in_R8 = *in_R8 + 1;
          *in_RDX = *in_RDX + 1;
          *(int *)CONCAT17(pe2,in_stack_00000040) = *(int *)CONCAT17(pe2,in_stack_00000040) + 1;
        }
        if (val1->ref < val2->ref) break;
        if ((in_stack_00000008 & 1) == 0) {
          calculateProb0(this_00,in_stack_ffffffffffffff98,
                         (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          *in_stack_00000018 = *in_stack_00000018 + 1;
          *in_RDX = *in_RDX + 1;
        }
        else {
          uVar1 = AlignmentRecord::getStart1((AlignmentRecord *)v1);
          uVar2 = AlignmentRecord::getEnd1(in_stack_00000028);
          if ((uVar2 < uVar1) &&
             (uVar1 = val2->ref, uVar2 = AlignmentRecord::getStart2(in_stack_00000028),
             uVar1 < uVar2)) {
            *in_RDX = *in_RDX + 1;
          }
          else {
            calculateProb0(this_00,in_stack_ffffffffffffff98,
                           (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            *in_stack_00000018 = *in_stack_00000018 + 1;
            *in_RDX = *in_RDX + 1;
          }
        }
      }
      if ((in_SIL & 1) != 0) break;
      calculateProb0(this_00,in_stack_ffffffffffffff98,
                     (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      *in_stack_00000018 = *in_stack_00000018 + 1;
      *in_R8 = *in_R8 + 1;
    }
    in_stack_ffffffffffffff94 = AlignmentRecord::getStart1(in_stack_00000028);
    uVar1 = AlignmentRecord::getEnd1((AlignmentRecord *)v1);
    if (uVar1 < in_stack_ffffffffffffff94) {
      in_stack_ffffffffffffff90 = val1->ref;
      uVar1 = AlignmentRecord::getStart2((AlignmentRecord *)v1);
      if (in_stack_ffffffffffffff90 < uVar1) {
        *in_R8 = *in_R8 + 1;
        goto LAB_00266175;
      }
    }
    calculateProb0(this_00,in_stack_ffffffffffffff98,
                   (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    *in_stack_00000018 = *in_stack_00000018 + 1;
    *in_R8 = *in_R8 + 1;
  } while( true );
}

Assistant:

void NewEdgeCalculator::iterateCovAp(bool pe1, unsigned int& pos2, double& probM, unsigned int& pos1, unsigned int& equalBase, bool pe2, const std::vector<AlignmentRecord::mapValue>& cov_ap2, int& tc, double& prob0, const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap1, const AlignmentRecord& ap1, int& cc) const
{
    while(pos1<cov_ap1.size() && pos2<cov_ap2.size()){
        auto& v1 = cov_ap1[pos1];
        auto& v2 = cov_ap2[pos2];
        if (v1.ref == v2.ref){
            if(v1.base == v2.base){
                equalBase++;
            }
            calculateProbM(v1,v2,probM);
            aub.emplace_back(pos1,pos2);
            pos1++;
            pos2++;
            cc++;
        }
        else if (v1.ref < v2.ref){
           if (!pe1){
               calculateProb0(v1,prob0);
               tc++;
               pos1++;
           } else {
                if (ap2.getStart1() > ap1.getEnd1() && v1.ref < ap1.getStart2()) pos1++;
                else{
                    calculateProb0(v1,prob0);
                    tc++;
                    pos1++;
                }
           } /*else if (!pe1 && pe2){
                calculateProb0(v1,prob0);
                tc++;
                pos1++;
           }*//*else if (pe1 && pe2){
                if(ap1.getEnd1() < ap2.getStart1() && v1.ref < ap1.getStart2()) pos1++;
                else{
                    calculateProb0(v1,prob0);
                    tc++;
                    pos1++;
                }
           }*/
        }
        else {
               if (!pe2){
                   calculateProb0(v2,prob0);
                   tc++;
                   pos2++;
               } else {
                   if (ap1.getStart1() > ap2.getEnd1() && v2.ref < ap2.getStart2()) pos2++;
                   else{
                       calculateProb0(v2,prob0);
                       tc++;
                       pos2++;
                   }
               } /*else if (pe1 && pe2){
                    if(ap2.getEnd1() < ap1.getStart1() && v1.ref < ap2.getStart2()) pos2++;
                    else{
                        calculateProb0(v2,prob0);
                        tc++;
                        pos2++;
                    }
               }*/
        }
    }
}